

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.h
# Opt level: O2

u32 __thiscall HighsMatrixColoring::color(HighsMatrixColoring *this,double value)

{
  iterator __pos;
  double local_18;
  double local_10;
  
  local_18 = value - this->tolerance;
  local_10 = value;
  __pos = std::
          _Rb_tree<double,_std::pair<const_double,_unsigned_int>,_std::_Select1st<std::pair<const_double,_unsigned_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
          ::lower_bound((_Rb_tree<double,_std::pair<const_double,_unsigned_int>,_std::_Select1st<std::pair<const_double,_unsigned_int>_>,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_int>_>_>
                         *)this,&local_18);
  if (((_Rb_tree_header *)__pos._M_node == &(this->colorMap)._M_t._M_impl.super__Rb_tree_header) ||
     (value + this->tolerance < *(double *)(__pos._M_node + 1))) {
    local_18 = (double)((this->colorMap)._M_t._M_impl.super__Rb_tree_header._M_node_count + 1);
    __pos = std::
            _Rb_tree<double,std::pair<double_const,unsigned_int>,std::_Select1st<std::pair<double_const,unsigned_int>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_int>>>
            ::_M_emplace_hint_unique<double&,unsigned_long>
                      ((_Rb_tree<double,std::pair<double_const,unsigned_int>,std::_Select1st<std::pair<double_const,unsigned_int>>,std::less<double>,std::allocator<std::pair<double_const,unsigned_int>>>
                        *)this,__pos._M_node,&local_10,(unsigned_long *)&local_18);
  }
  return *(u32 *)&__pos._M_node[1]._M_parent;
}

Assistant:

u32 color(double value) {
    // iterator points to smallest element in map which fulfills key >= value -
    // tolerance
    auto it = colorMap.lower_bound(value - tolerance);
    // check if there is no such element, or if this element has a key value +
    // tolerance in which case we create a new color and store it with the key
    // value
    if (it == colorMap.end() || it->first > value + tolerance)
      it = colorMap.emplace_hint(it, value, colorMap.size() + 1);
    return it->second;
  }